

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::anon_unknown_1::TrigonometricGroup::init
          (TrigonometricGroup *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *node_00;
  undefined8 extraout_RAX;
  undefined8 uVar1;
  RandomShaderCase *pRVar2;
  undefined8 extraout_RAX_00;
  int seed;
  deUint32 seed_00;
  ProgramParameters params;
  
  rsg::ProgramParameters::ProgramParameters(&params);
  params.useScalarConversions = true;
  params.useSwizzle = true;
  params.trigonometricBaseWeight = 4.0;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Vertex-only tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Fragment-only tests");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  uVar1 = extraout_RAX;
  for (seed_00 = 0; seed_00 != 100; seed_00 = seed_00 + 1) {
    pRVar2 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Trigonometric ops in vertex shader",
                        &params,seed_00,true,false);
    tcu::TestNode::addChild(node,(TestNode *)pRVar2);
    pRVar2 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Trigonometric ops in fragment shader"
                        ,&params,seed_00,false,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pRVar2);
    uVar1 = extraout_RAX_00;
  }
  return (int)uVar1;
}

Assistant:

void init (void)
	{
		rsg::ProgramParameters params;
		params.useScalarConversions		= true;
		params.useSwizzle				= true;
		params.trigonometricBaseWeight	= 4.0f;

		tcu::TestCaseGroup* vertexGroup = new tcu::TestCaseGroup(m_testCtx, "vertex", "Vertex-only tests");
		addChild(vertexGroup);

		tcu::TestCaseGroup* fragmentGroup = new tcu::TestCaseGroup(m_testCtx, "fragment", "Fragment-only tests");
		addChild(fragmentGroup);

		for (int seed = 0; seed < 100; seed++)
		{
			vertexGroup->addChild(createRandomShaderCase(m_context,		"Trigonometric ops in vertex shader",	params, seed, true, false));
			fragmentGroup->addChild(createRandomShaderCase(m_context,	"Trigonometric ops in fragment shader",	params, seed, false, true));
		}
	}